

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupToLevel(int remaining,bool restore_focus_to_window_under_popup)

{
  ImGuiPopupData *pIVar1;
  ImGuiWindow *under_this_window;
  ImGuiContext *pIVar2;
  ImGuiViewport *filter_viewport;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  if ((GImGui->DebugLogFlags & 4) != 0) {
    DebugLog("[popup] ClosePopupToLevel(%d), restore_under=%d\n",(ulong)(uint)remaining,
             (ulong)restore_focus_to_window_under_popup);
  }
  pIVar1 = (pIVar2->OpenPopupStack).Data;
  under_this_window = pIVar1[remaining].Window;
  window = pIVar1[remaining].RestoreNavWindow;
  ImVector<ImGuiPopupData>::resize(&pIVar2->OpenPopupStack,remaining);
  if ((!restore_focus_to_window_under_popup) || (under_this_window == (ImGuiWindow *)0x0)) {
    return;
  }
  if ((under_this_window->Flags & 0x10000000) != 0) {
    window = under_this_window->ParentWindow;
  }
  if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
    FocusTopMostWindowUnderOne(under_this_window,(ImGuiWindow *)0x0,filter_viewport,1);
    return;
  }
  FocusWindow(window,(uint)(pIVar2->NavLayer == ImGuiNavLayer_Main));
  return;
}

Assistant:

void ImGui::ClosePopupToLevel(int remaining, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_POPUP("[popup] ClosePopupToLevel(%d), restore_under=%d\n", remaining, restore_focus_to_window_under_popup);
    IM_ASSERT(remaining >= 0 && remaining < g.OpenPopupStack.Size);

    // Trim open popup stack
    ImGuiPopupData prev_popup = g.OpenPopupStack[remaining];
    g.OpenPopupStack.resize(remaining);

    // Restore focus (unless popup window was not yet submitted, and didn't have a chance to take focus anyhow. See #7325 for an edge case)
    if (restore_focus_to_window_under_popup && prev_popup.Window)
    {
        ImGuiWindow* popup_window = prev_popup.Window;
        ImGuiWindow* focus_window = (popup_window->Flags & ImGuiWindowFlags_ChildMenu) ? popup_window->ParentWindow : prev_popup.RestoreNavWindow;
        if (focus_window && !focus_window->WasActive)
            FocusTopMostWindowUnderOne(popup_window, NULL, NULL, ImGuiFocusRequestFlags_RestoreFocusedChild); // Fallback
        else
            FocusWindow(focus_window, (g.NavLayer == ImGuiNavLayer_Main) ? ImGuiFocusRequestFlags_RestoreFocusedChild : ImGuiFocusRequestFlags_None);
    }
}